

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

shared_ptr<kratos::ConditionalExpr> __thiscall
kratos::ConditionalExpr::create
          (ConditionalExpr *this,shared_ptr<kratos::Var> *condition,int64_t left,
          shared_ptr<kratos::Var> *right)

{
  uint32_t width;
  Const *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<kratos::ConditionalExpr> sVar3;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  shared_ptr<kratos::Var> left_const;
  
  width = (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  pCVar1 = Const::constant(left,width,
                           ((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->is_signed_);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            (local_40,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                      &(pCVar1->super_Var).super_enable_shared_from_this<kratos::Var>);
  std::__shared_ptr<kratos::ConditionalExpr,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::ConditionalExpr>,std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>&,std::shared_ptr<kratos::Var>const&>
            ((__shared_ptr<kratos::ConditionalExpr,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<kratos::ConditionalExpr> *)
             ((long)&left_const.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),condition,(shared_ptr<kratos::Var> *)local_40,right);
  _Var2._M_pi = extraout_RDX;
  if (left_const.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               left_const.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::ConditionalExpr>)
         sVar3.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ConditionalExpr> ConditionalExpr::create(const std::shared_ptr<Var> &condition,
                                                         int64_t left,
                                                         const std::shared_ptr<Var> &right) {
    auto left_const = Const::constant(left, right->width(), right->is_signed()).shared_from_this();
    return std::make_shared<ConditionalExpr>(condition, left_const, right);
}